

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O1

void __thiscall TcpConn::~TcpConn(TcpConn *this)

{
  Poller *this_00;
  BufferChain *pBVar1;
  uint32_t uVar2;
  BufferChain *pBVar3;
  
  (this->super_PollObj)._vptr_PollObj = (_func_int **)&PTR__TcpConn_00108d00;
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&DAT_00108d68;
  this_00 = (this->super_PollObj).m_pPoller;
  if (this_00 != (Poller *)0x0) {
    Poller::Remove(this_00,&this->super_PollObj);
  }
  pBVar3 = (this->super_Buffer).m_head;
  if (pBVar3 != (BufferChain *)0x0) {
    do {
      if (pBVar3->refcount == 0) {
        __assert_fail("tmp->refcount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.h"
                      ,0x2d,"void Buffer::Clear()");
      }
      pBVar1 = pBVar3->nextpkt;
      uVar2 = pBVar3->refcount - 1;
      pBVar3->refcount = uVar2;
      if (uVar2 == 0) {
        (*(this->super_Buffer)._vptr_Buffer[1])(&this->super_Buffer);
      }
      pBVar3 = pBVar1;
    } while (pBVar1 != (BufferChain *)0x0);
  }
  (this->super_Buffer).len = 0;
  (this->super_Buffer).m_writeHead = (BufferChain *)0x0;
  (this->super_Buffer).m_writeTail = (BufferChain *)0x0;
  (this->super_Buffer).m_head = (BufferChain *)0x0;
  (this->super_Buffer).m_end = (BufferChain *)0x0;
  Socket::~Socket(&(this->m_socket).super_Socket);
  return;
}

Assistant:

TcpConn::~TcpConn()
{
    if(this->m_pPoller != nullptr)
        m_pPoller->Remove(this);
    Clear();
}